

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

uint mergeSectUnion(Section *sect,SectionType type,uint32_t org,uint8_t alignment,
                   uint16_t alignOffset)

{
  bool bVar1;
  uint local_20;
  uint nbSectErrors;
  uint16_t alignOffset_local;
  uint8_t alignment_local;
  uint32_t org_local;
  SectionType type_local;
  Section *sect_local;
  
  if (0xf < alignment) {
    __assert_fail("alignment < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/section.cpp"
                  ,0x80,"mergeSectUnion");
  }
  bVar1 = sect_HasData(type);
  if (bVar1) {
    error("Cannot declare ROM sections as UNION\n");
  }
  local_20 = (uint)bVar1;
  if (org == 0xffffffff) {
    if (alignment != '\0') {
      if (sect->org == 0xffffffff) {
        if (((uint)alignOffset & (1 << (sect->align & 0x1f)) - 1U) ==
            ((uint)sect->alignOfs & (1 << (alignment & 0x1f)) - 1U)) {
          if (sect->align < alignment) {
            sect->align = alignment;
            sect->alignOfs = alignOffset;
          }
        }
        else {
          error("Section already declared with incompatible %u-byte alignment (offset %u)\n",
                (ulong)(uint)(1 << (sect->align & 0x1f)),(ulong)sect->alignOfs);
          local_20 = local_20 + 1;
        }
      }
      else if ((sect->org - (uint)alignOffset & (1 << (alignment & 0x1f)) - 1U) != 0) {
        error("Section already declared as fixed at incompatible address $%04x\n",(ulong)sect->org);
        local_20 = local_20 + 1;
      }
    }
  }
  else if ((sect->org == 0xffffffff) || (sect->org == org)) {
    if ((sect->align == '\0') || (((1 << (sect->align & 0x1f)) - 1U & org - sect->alignOfs) == 0)) {
      sect->org = org;
    }
    else {
      error("Section already declared as aligned to %u bytes (offset %u)\n",
            (ulong)(uint)(1 << (sect->align & 0x1f)),(ulong)sect->alignOfs);
      local_20 = local_20 + 1;
    }
  }
  else {
    error("Section already declared as fixed at different address $%04x\n",(ulong)sect->org);
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

static unsigned int mergeSectUnion(struct Section *sect, enum SectionType type, uint32_t org,
				   uint8_t alignment, uint16_t alignOffset)
{
	assert(alignment < 16); // Should be ensured by the caller
	unsigned int nbSectErrors = 0;

	// Unionized sections only need "compatible" constraints, and they end up with the strictest
	// combination of both.
	if (sect_HasData(type))
		fail("Cannot declare ROM sections as UNION\n");

	if (org != (uint32_t)-1) {
		// If both are fixed, they must be the same
		if (sect->org != (uint32_t)-1 && sect->org != org)
			fail("Section already declared as fixed at different address $%04"
			     PRIx32 "\n", sect->org);
		else if (sect->align != 0 && (mask(sect->align) & (org - sect->alignOfs)))
			fail("Section already declared as aligned to %u bytes (offset %"
				   PRIu16 ")\n", 1U << sect->align, sect->alignOfs);
		else
			// Otherwise, just override
			sect->org = org;

	} else if (alignment != 0) {
		// Make sure any fixed address given is compatible
		if (sect->org != (uint32_t)-1) {
			if ((sect->org - alignOffset) & mask(alignment))
				fail("Section already declared as fixed at incompatible address $%04"
				     PRIx32 "\n", sect->org);
		// Check if alignment offsets are compatible
		} else if ((alignOffset & mask(sect->align))
			   != (sect->alignOfs & mask(alignment))) {
			fail("Section already declared with incompatible %u"
			     "-byte alignment (offset %" PRIu16 ")\n",
			     1U << sect->align, sect->alignOfs);
		} else if (alignment > sect->align) {
			// If the section is not fixed, its alignment is the largest of both
			sect->align = alignment;
			sect->alignOfs = alignOffset;
		}
	}

	return nbSectErrors;
}